

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O0

void __thiscall higan::InetAddress::InetAddress(InetAddress *this,int port)

{
  allocator<char> local_39;
  string local_38;
  int local_14;
  InetAddress *pIStack_10;
  int port_local;
  InetAddress *this_local;
  
  local_14 = port;
  pIStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"0.0.0.0",&local_39);
  InetAddress(this,&local_38,local_14);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return;
}

Assistant:

InetAddress::InetAddress(int port):
		InetAddress("0.0.0.0", port)
{

}